

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::FixIndentation::fields
          (FixIndentation *this,ObjectFields *fields,Indent *indent,bool space_before)

{
  Kind KVar1;
  bool bVar2;
  reference pOVar3;
  size_type sVar4;
  byte in_CL;
  long in_RDX;
  long in_RDI;
  Indent new_indent2_2;
  Indent new_indent2_1;
  Indent new_indent2;
  ObjectField *field;
  iterator __end2;
  iterator __begin2;
  ObjectFields *__range2;
  bool first;
  uint new_indent;
  undefined1 in_stack_0000057f;
  Indent *in_stack_00000580;
  AST *in_stack_00000588;
  FixIndentation *in_stack_00000590;
  Fodder *in_stack_ffffffffffffff38;
  FixIndentation *in_stack_ffffffffffffff40;
  undefined3 uVar5;
  undefined4 in_stack_ffffffffffffff48;
  Hide in_stack_ffffffffffffff4c;
  FixIndentation *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5f;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_38 [2];
  byte local_21;
  undefined4 local_20;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_20 = *(undefined4 *)(in_RDX + 4);
  local_21 = 1;
  local_38[0]._M_current =
       (ObjectField *)
       std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
       ::begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                *)in_stack_ffffffffffffff38);
  std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::end
            ((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              *)in_stack_ffffffffffffff38);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_ffffffffffffff40,
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_ffffffffffffff38), bVar2) {
    pOVar3 = __gnu_cxx::
             __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
             ::operator*(local_38);
    if ((local_21 & 1) == 0) {
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
    }
    KVar1 = pOVar3->kind;
    if (KVar1 == ASSERT) {
      in_stack_ffffffffffffff40 = (FixIndentation *)&pOVar3->fodder1;
      uVar5 = (undefined3)in_stack_ffffffffffffff48;
      in_stack_ffffffffffffff48 = CONCAT13(1,uVar5);
      if ((local_21 & 1) != 0) {
        in_stack_ffffffffffffff48 = CONCAT13(local_19,uVar5);
      }
      fill(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false,false,0x24a5fe);
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 6;
      internal::open_fodder((AST *)0x24a620);
      newIndent((FixIndentation *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                (Fodder *)in_stack_ffffffffffffff50,
                (Indent *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      expr(in_stack_00000590,in_stack_00000588,in_stack_00000580,(bool)in_stack_0000057f);
      if (pOVar3->expr3 != (AST *)0x0) {
        fill(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false,false,0x24a69d);
        *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
        expr(in_stack_00000590,in_stack_00000588,in_stack_00000580,(bool)in_stack_0000057f);
      }
    }
    else if (KVar1 - FIELD_ID < 3) {
      if (pOVar3->kind == FIELD_ID) {
        fill(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false,false,0x24a34f);
        sVar4 = std::__cxx11::
                basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                length(&pOVar3->id->name);
        *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + (int)sVar4;
      }
      else if (pOVar3->kind == FIELD_STR) {
        expr(in_stack_00000590,in_stack_00000588,in_stack_00000580,(bool)in_stack_0000057f);
      }
      else if (pOVar3->kind == FIELD_EXPR) {
        in_stack_ffffffffffffff50 = (FixIndentation *)&pOVar3->fodder1;
        in_stack_ffffffffffffff5f = 1;
        if ((local_21 & 1) != 0) {
          in_stack_ffffffffffffff5f = local_19;
        }
        fill(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false,false,0x24a442);
        *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
        expr(in_stack_00000590,in_stack_00000588,in_stack_00000580,(bool)in_stack_0000057f);
        fill(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false,false,0x24a48d);
        *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
      }
      fieldParams(in_stack_ffffffffffffff50,
                  (ObjectField *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                  (Indent *)in_stack_ffffffffffffff40);
      fill(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false,false,0x24a4de);
      if ((pOVar3->superSugar & 1U) != 0) {
        *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
      }
      in_stack_ffffffffffffff4c = pOVar3->hide;
      if (in_stack_ffffffffffffff4c == HIDDEN) {
        *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 2;
      }
      else if (in_stack_ffffffffffffff4c == INHERIT) {
        *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
      }
      else if (in_stack_ffffffffffffff4c == VISIBLE) {
        *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 3;
      }
      internal::open_fodder((AST *)0x24a567);
      newIndent((FixIndentation *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                (Fodder *)in_stack_ffffffffffffff50,
                (Indent *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      expr(in_stack_00000590,in_stack_00000588,in_stack_00000580,(bool)in_stack_0000057f);
    }
    else if (KVar1 == LOCAL) {
      fill(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false,false,0x24a1f4);
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 5;
      fill(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false,false,0x24a226);
      sVar4 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                        (&pOVar3->id->name);
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + (int)sVar4;
      fieldParams(in_stack_ffffffffffffff50,
                  (ObjectField *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                  (Indent *)in_stack_ffffffffffffff40);
      fill(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false,false,0x24a289);
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
      internal::open_fodder((AST *)0x24a2ab);
      newIndent((FixIndentation *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                (Fodder *)in_stack_ffffffffffffff50,
                (Indent *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      expr(in_stack_00000590,in_stack_00000588,in_stack_00000580,(bool)in_stack_0000057f);
    }
    local_21 = 0;
    fill(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false,false,0x24a6f8);
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(local_38);
  }
  return;
}

Assistant:

void fields(ObjectFields &fields, const Indent &indent, bool space_before)
    {
        unsigned new_indent = indent.lineUp;
        bool first = true;
        for (auto &field : fields) {
            if (!first)
                column++;  // ','

            switch (field.kind) {
                case ObjectField::LOCAL: {
                    fill(field.fodder1, !first || space_before, true, indent.lineUp);
                    column += 5;  // local
                    fill(field.fodder2, true, true, indent.lineUp);
                    column += field.id->name.length();
                    fieldParams(field, indent);
                    fill(field.opFodder, true, true, indent.lineUp);
                    column++;  // =
                    Indent new_indent2 = newIndent(open_fodder(field.expr2), indent, column);
                    expr(field.expr2, new_indent2, true);
                } break;

                case ObjectField::FIELD_ID:
                case ObjectField::FIELD_STR:
                case ObjectField::FIELD_EXPR: {
                    if (field.kind == ObjectField::FIELD_ID) {
                        fill(field.fodder1, !first || space_before, true, new_indent);
                        column += field.id->name.length();

                    } else if (field.kind == ObjectField::FIELD_STR) {
                        expr(field.expr1, indent, !first || space_before);

                    } else if (field.kind == ObjectField::FIELD_EXPR) {
                        fill(field.fodder1, !first || space_before, true, new_indent);
                        column++;  // [
                        expr(field.expr1, indent, false);
                        fill(field.fodder2, false, false, new_indent);
                        column++;  // ]
                    }

                    fieldParams(field, indent);

                    fill(field.opFodder, false, false, new_indent);

                    if (field.superSugar)
                        column++;
                    switch (field.hide) {
                        case ObjectField::INHERIT: column += 1; break;
                        case ObjectField::HIDDEN: column += 2; break;
                        case ObjectField::VISIBLE: column += 3; break;
                    }
                    Indent new_indent2 = newIndent(open_fodder(field.expr2), indent, column);
                    expr(field.expr2, new_indent2, true);

                } break;

                case ObjectField::ASSERT: {
                    fill(field.fodder1, !first || space_before, true, new_indent);
                    column += 6;  // assert
                    // + 1 for the space after the assert
                    Indent new_indent2 = newIndent(open_fodder(field.expr2), indent, column + 1);
                    expr(field.expr2, indent, true);
                    if (field.expr3 != nullptr) {
                        fill(field.opFodder, true, true, new_indent2.lineUp);
                        column++;  // ":"
                        expr(field.expr3, new_indent2, true);
                    }
                } break;
            }

            first = false;
            fill(field.commaFodder, false, false, new_indent);
        }
    }